

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3-write.c
# Opt level: O2

int mp3_fill_si(mp3_frame_t *frame)

{
  uchar uVar1;
  uint numbits;
  uint *puVar2;
  uint band;
  long lVar3;
  uint *puVar4;
  mp3_channel_t *pmVar5;
  uint j;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  uint local_5c;
  ulong local_58;
  bv_t bv;
  
  if (frame != (mp3_frame_t *)0x0) {
    uVar1 = frame->id;
    bv_init(&bv,frame->raw + (ulong)(frame->protected == '\0') * 2 + 4,(uint)frame->si_bitsize);
    bVar8 = frame->mode == '\x03';
    uVar7 = 2 - bVar8;
    numbits = bVar8 + 3 + (uint)bVar8;
    if (uVar1 != '\x03') {
      numbits = uVar7;
    }
    bv_put_bits(&bv,(ulong)(frame->si).main_data_end,uVar1 == '\x03' | 8);
    bv_put_bits(&bv,(ulong)(frame->si).private_bits,numbits);
    if (uVar1 == '\x03') {
      local_5c = 4;
      pmVar5 = (frame->si).channel;
      for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
        for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
          bv_put_bits(&bv,(ulong)pmVar5->scfsi[lVar3],1);
        }
        pmVar5 = pmVar5 + 1;
      }
    }
    else {
      local_5c = 9;
    }
    local_58 = (ulong)uVar7;
    puVar4 = (frame->si).channel[0].granule[0].sub_gain;
    puVar2 = (frame->si).channel[0].granule[0].tbl_sel;
    for (uVar6 = 0; uVar6 != local_58; uVar6 = uVar6 + 1) {
      bv_put_bits(&bv,(long)(frame->si).channel[uVar6].granule[0].part2_3_length,0xc);
      bv_put_bits(&bv,(ulong)(frame->si).channel[uVar6].granule[0].big_values,9);
      bv_put_bits(&bv,(ulong)(frame->si).channel[uVar6].granule[0].global_gain,8);
      bv_put_bits(&bv,(ulong)(frame->si).channel[uVar6].granule[0].scale_comp,local_5c);
      bv_put_bits(&bv,(ulong)(frame->si).channel[uVar6].granule[0].blocksplit_flag,1);
      if ((frame->si).channel[uVar6].granule[0].blocksplit_flag == 0) {
        for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
          bv_put_bits(&bv,(ulong)puVar2[lVar3],5);
        }
        bv_put_bits(&bv,(ulong)(frame->si).channel[uVar6].granule[0].reg0_cnt,4);
        bv_put_bits(&bv,(ulong)(frame->si).channel[uVar6].granule[0].reg1_cnt,3);
      }
      else {
        bv_put_bits(&bv,(ulong)(frame->si).channel[uVar6].granule[0].block_type,2);
        bv_put_bits(&bv,(ulong)(frame->si).channel[uVar6].granule[0].switch_point,1);
        bv_put_bits(&bv,(ulong)(frame->si).channel[uVar6].granule[0].tbl_sel[0],5);
        bv_put_bits(&bv,(ulong)(frame->si).channel[uVar6].granule[0].tbl_sel[1],5);
        for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
          bv_put_bits(&bv,(ulong)puVar4[lVar3],3);
        }
      }
      if (uVar1 == '\x03') {
        bv_put_bits(&bv,(ulong)(frame->si).channel[uVar6].granule[0].preflag,1);
      }
      bv_put_bits(&bv,(ulong)(frame->si).channel[uVar6].granule[0].scale_scale,1);
      bv_put_bits(&bv,(ulong)(frame->si).channel[uVar6].granule[0].cnt1tbl_sel,1);
      puVar4 = puVar4 + 0x9ca;
      puVar2 = puVar2 + 0x9ca;
    }
    return 1;
  }
  __assert_fail("frame != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-write.c",0x18,
                "int mp3_fill_si(mp3_frame_t *)");
}

Assistant:

int mp3_fill_si(mp3_frame_t *frame) {
  assert(frame != NULL);
  assert((frame->si_bitsize != 0) ||
         "Trying to write an empty sideinfo");

  const int is_lsf = frame->id != MPEG_VERSION_1; // MPEG 2 and 2.5 are Lower Sampling Frequency extension

  unsigned char *ptr = frame->raw + 4;
  if (frame->protected == 0)
    ptr += 2;

  bv_t bv;
  bv_init(&bv, ptr, frame->si_bitsize);

  mp3_si_t *si = &frame->si;
  unsigned int nch = (frame->mode != 3) ? 2 : 1;

  bv_put_bits(&bv, si->main_data_end, is_lsf ? 8 : 9);
  const int private_bitlen = is_lsf ? ((nch == 1) ? 1 : 2) :
                             ((nch == 1) ? 5 : 3);
  bv_put_bits(&bv, si->private_bits, private_bitlen);

  unsigned int i;
  int ngr = 1;

  if (!is_lsf) {
    for (i = 0; i < nch; i++) {
      unsigned int band;
      for (band = 0; band < 4; band++)
        bv_put_bits(&bv, si->channel[i].scfsi[band], 1);
    }
  }

  unsigned int gri;
  for (gri = 0; gri < ngr; gri++) {
    for (i = 0; i < nch; i++) {
      mp3_granule_t *gr = &si->channel[i].granule[gri];

      bv_put_bits(&bv, gr->part2_3_length, 12);
      bv_put_bits(&bv, gr->big_values, 9);
      bv_put_bits(&bv, gr->global_gain, 8);
      bv_put_bits(&bv, gr->scale_comp, is_lsf ? 9 : 4);
      bv_put_bits(&bv, gr->blocksplit_flag, 1);

      if (gr->blocksplit_flag) {
        bv_put_bits(&bv, gr->block_type, 2);
        bv_put_bits(&bv, gr->switch_point, 1);
        bv_put_bits(&bv, gr->tbl_sel[0], 5);
        bv_put_bits(&bv, gr->tbl_sel[1], 5);

        unsigned int j;
        for (j = 0; j < 3; j++)
          bv_put_bits(&bv, gr->sub_gain[j], 3);
      } else {
        unsigned int j;
        for (j = 0; j < 3; j++)
          bv_put_bits(&bv, gr->tbl_sel[j], 5);

        bv_put_bits(&bv, gr->reg0_cnt, 4);
        bv_put_bits(&bv, gr->reg1_cnt, 3);
      }

      if (!is_lsf) {
        bv_put_bits(&bv, gr->preflag, 1);
      }
      bv_put_bits(&bv, gr->scale_scale, 1);
      bv_put_bits(&bv, gr->cnt1tbl_sel, 1);
    }
  }

  assert((bv.len == bv.idx) || "Bitvector is not filled completely");

  return 1;
}